

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O2

bool __thiscall gss::innards::HomomorphismModel::prepare(HomomorphismModel *this)

{
  byte *pbVar1;
  int iVar2;
  pointer ppVar3;
  pointer ppVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  reference pvVar9;
  uint *puVar10;
  reference pvVar11;
  reference pvVar12;
  ProofError *this_00;
  UnsupportedConfiguration *this_01;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var13;
  uint i_4;
  uint g_2;
  long lVar14;
  uint j;
  uint uVar15;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __i;
  pointer ppVar16;
  ulong uVar17;
  uint i;
  ulong uVar18;
  uint i_2;
  long *plVar19;
  int local_4b0;
  uint next_pattern_supplemental;
  Proof *local_4a0;
  uint next_target_supplemental;
  long *local_490;
  uint local_484;
  long *local_480;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> t_gds;
  vector<int,_std::allocator<int>_> n_p;
  vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  named_two_away_from_t;
  vector<int,_std::allocator<int>_> n_t;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  between_p_and_q;
  NamedVertex named_p_1;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  named_n_t;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  named_n_t_w;
  value_type np;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  targets;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> p_gds;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  patterns;
  value_type n2_t;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  named_d_n_t;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  d3_from_t;
  
  bVar5 = is_nonshrinking(((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                          _M_head_impl)->params);
  if ((bVar5) && (this->target_size < this->pattern_size)) {
LAB_001237dd:
    bVar5 = false;
  }
  else {
    _Var13._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&np,"original",(allocator<char> *)&patterns);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(_Var13._M_head_impl)->supplemental_graph_names,(value_type *)&np);
    std::__cxx11::string::~string((string *)&np);
    pvVar9 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::at(&((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                   _M_head_impl)->patterns_degrees,0);
    std::vector<int,_std::allocator<int>_>::resize(pvVar9,(ulong)this->pattern_size);
    pvVar9 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::at(&((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                   _M_head_impl)->targets_degrees,0);
    std::vector<int,_std::allocator<int>_>::resize(pvVar9,(ulong)this->target_size);
    for (uVar18 = 0; uVar18 < this->pattern_size; uVar18 = uVar18 + 1) {
      uVar6 = SVOBitset::count((SVOBitset *)
                               ((ulong)(this->max_graphs * (int)uVar18) * 0x88 +
                               *(long *)&(((this->_imp)._M_t.
                                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           .
                                           super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                          ._M_head_impl)->pattern_graph_rows).
                                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                               ));
      pvVar9 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at(&((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                     _M_head_impl)->patterns_degrees,0);
      puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::at(pvVar9,uVar18);
      *puVar10 = uVar6;
    }
    for (uVar18 = 0;
        _Var13._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl,
        uVar18 < this->target_size; uVar18 = uVar18 + 1) {
      uVar6 = SVOBitset::count((SVOBitset *)
                               ((ulong)(this->max_graphs * (int)uVar18) * 0x88 +
                               *(long *)&((_Var13._M_head_impl)->target_graph_rows).
                                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                               ));
      pvVar9 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at(&((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                     _M_head_impl)->targets_degrees,0);
      puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::at(pvVar9,uVar18);
      *puVar10 = uVar6;
    }
    bVar5 = global_degree_is_preserved((_Var13._M_head_impl)->params);
    if (bVar5) {
      t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      for (np._data.short_data[0]._0_4_ = 0; (uint)np._data.short_data[0]._0_4_ < this->pattern_size
          ; np._data.short_data[0]._0_4_ = np._data.short_data[0]._0_4_ + 1) {
        pvVar9 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::at(&((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                       _M_head_impl)->patterns_degrees,0);
        pvVar11 = std::vector<int,_std::allocator<int>_>::at
                            (pvVar9,(ulong)(uint)np._data.short_data[0]._0_4_);
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<unsigned_int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&p_gds,
                   (uint *)&np,pvVar11);
      }
      for (np._data.short_data[0]._0_4_ = 0;
          ppVar4 = p_gds.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
          ppVar3 = p_gds.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
          (uint)np._data.short_data[0]._0_4_ < this->target_size;
          np._data.short_data[0]._0_4_ = np._data.short_data[0]._0_4_ + 1) {
        pvVar9 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::at(&((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                       _M_head_impl)->targets_degrees,0);
        pvVar11 = std::vector<int,_std::allocator<int>_>::at
                            (pvVar9,(ulong)(uint)np._data.short_data[0]._0_4_);
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<unsigned_int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&t_gds,
                   (uint *)&np,pvVar11);
      }
      if (p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          p_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        lVar14 = (long)p_gds.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)p_gds.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__0>>
                  (p_gds.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   p_gds.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar14 >> 3) * 2 ^ 0x7e);
        if (lVar14 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__0>>
                    (ppVar3,ppVar4);
        }
        else {
          ppVar16 = ppVar3 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__0>>
                    (ppVar3,ppVar16);
          for (; ppVar16 != ppVar4; ppVar16 = ppVar16 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Val_comp_iter<gss::innards::HomomorphismModel::prepare()::__0>>
                      (ppVar16);
          }
        }
      }
      ppVar4 = t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      ppVar3 = t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        lVar14 = (long)t_gds.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)t_gds.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__1>>
                  (t_gds.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   t_gds.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar14 >> 3) * 2 ^ 0x7e);
        if (lVar14 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__1>>
                    (ppVar3,ppVar4);
        }
        else {
          ppVar16 = ppVar3 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<gss::innards::HomomorphismModel::prepare()::__1>>
                    (ppVar3,ppVar16);
          for (; ppVar16 != ppVar4; ppVar16 = ppVar16 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Val_comp_iter<gss::innards::HomomorphismModel::prepare()::__1>>
                      (ppVar16);
          }
        }
      }
      uVar6 = 0;
LAB_0012264b:
      plVar19 = (long *)(ulong)uVar6;
      if (plVar19 < (long *)((long)p_gds.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)p_gds.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        pvVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::at
                            (&p_gds,(size_type)plVar19);
        iVar2 = pvVar12->second;
        pvVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::at
                            (&t_gds,(size_type)plVar19);
        if (iVar2 <= pvVar12->second) goto code_r0x00122689;
        if (*(long *)&(((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                       _M_head_impl)->proof).
                      super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0) {
          uVar7 = 0;
          local_480 = plVar19;
          while (uVar7 <= uVar6) {
            n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            local_490 = (long *)CONCAT44(local_490._4_4_,uVar7);
            _Var13._M_head_impl =
                 (this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
            pvVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::at
                                (&p_gds,(ulong)uVar7);
            SVOBitset::SVOBitset
                      (&np,(SVOBitset *)
                           ((ulong)(this->max_graphs * pvVar12->first) * 0x88 +
                           *(long *)&((_Var13._M_head_impl)->pattern_graph_rows).
                                     super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                           ));
            for (uVar15 = 0; uVar8 = uVar6, uVar15 < this->pattern_size; uVar15 = uVar15 + 1) {
              bVar5 = SVOBitset::test(&np,uVar15);
              if (bVar5) {
                patterns.
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(patterns.
                                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar15);
                std::vector<int,_std::allocator<int>_>::emplace_back<int>(&n_p,(int *)&patterns);
              }
            }
            for (; uVar18 = (ulong)uVar8,
                uVar18 < (ulong)((long)t_gds.
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)t_gds.
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3);
                uVar8 = uVar8 + 1) {
              n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)0x0;
              n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0x0;
              _Var13._M_head_impl =
                   (this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                   _M_head_impl;
              pvVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::at
                                  (&t_gds,uVar18);
              SVOBitset::SVOBitset
                        ((SVOBitset *)&patterns,
                         (SVOBitset *)
                         ((ulong)(this->max_graphs * pvVar12->first) * 0x88 +
                         *(long *)&((_Var13._M_head_impl)->target_graph_rows).
                                   super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                         ));
              while (uVar15 = SVOBitset::find_first((SVOBitset *)&patterns), uVar15 != 0xffffffff) {
                SVOBitset::reset((SVOBitset *)&patterns,uVar15);
                targets.
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(targets.
                                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar15);
                std::vector<int,_std::allocator<int>_>::emplace_back<int>
                          ((vector<int,_std::allocator<int>_> *)
                           &n_t.super__Vector_base<int,_std::allocator<int>_>,(int *)&targets);
              }
              local_4a0 = (((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                           _M_head_impl)->proof).
                          super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              pvVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::at
                                  (&p_gds,(ulong)uVar7);
              pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&targets,this,pvVar12->first);
              pvVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::at
                                  (&t_gds,uVar18);
              target_vertex_for_proof_abi_cxx11_((NamedVertex *)&n2_t,this,pvVar12->first);
              Proof::incompatible_by_degrees
                        (local_4a0,0,(NamedVertex *)&targets,&n_p,(NamedVertex *)&n2_t,
                         (vector<int,_std::allocator<int>_> *)
                         &n_t.super__Vector_base<int,_std::allocator<int>_>);
              std::__cxx11::string::~string((string *)((long)&n2_t._data + 8));
              std::__cxx11::string::~string
                        ((string *)
                         &targets.
                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
              SVOBitset::~SVOBitset((SVOBitset *)&patterns);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        (&n_t.super__Vector_base<int,_std::allocator<int>_>);
            }
            SVOBitset::~SVOBitset(&np);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&n_p.super__Vector_base<int,_std::allocator<int>_>);
            uVar7 = (uint)local_490 + 1;
          }
          targets.
          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          targets.
          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          targets.
          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          patterns.
          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          patterns.
          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          patterns.
          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          for (uVar7 = 0; uVar7 <= uVar6; uVar7 = uVar7 + 1) {
            pvVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::at
                                (&p_gds,(ulong)uVar7);
            pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&np,this,pvVar12->first);
            std::
            vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
            ::emplace_back<std::pair<int,std::__cxx11::string>>
                      ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                        *)&patterns,
                       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&np);
            std::__cxx11::string::~string((string *)((long)&np._data + 8));
          }
          for (plVar19 = (long *)0x0; local_480 != plVar19; plVar19 = (long *)((long)plVar19 + 1)) {
            pvVar12 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::at
                                (&t_gds,(size_type)plVar19);
            target_vertex_for_proof_abi_cxx11_((NamedVertex *)&np,this,pvVar12->first);
            std::
            vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
            ::emplace_back<std::pair<int,std::__cxx11::string>>
                      ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                        *)&targets,
                       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&np);
            std::__cxx11::string::~string((string *)((long)&np._data + 8));
          }
          Proof::emit_hall_set_or_violator
                    ((((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                      _M_head_impl)->proof).
                     super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     &patterns,&targets);
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&targets);
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&patterns);
        }
        std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                  (&t_gds.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
        std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                  (&p_gds.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
        goto LAB_001237dd;
      }
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&t_gds.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&p_gds.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
    }
    next_pattern_supplemental = 1;
    next_target_supplemental = next_pattern_supplemental;
    bVar5 = supports_exact_path_graphs
                      (((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                       _M_head_impl)->params);
    _Var13._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    if (bVar5) {
      _build_exact_path_graphs
                (this,&(_Var13._M_head_impl)->pattern_graph_rows,this->pattern_size,
                 &next_pattern_supplemental,*(uint *)((long)(_Var13._M_head_impl)->params + 0x68),
                 (_Var13._M_head_impl)->directed,false,true);
      _Var13._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      _build_exact_path_graphs
                (this,&(_Var13._M_head_impl)->target_graph_rows,this->target_size,
                 &next_target_supplemental,*(uint *)((long)(_Var13._M_head_impl)->params + 0x68),
                 (_Var13._M_head_impl)->directed,false,false);
      _Var13._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      if (((_Var13._M_head_impl)->proof).
          super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        for (uVar18 = 1;
            (long)uVar18 <= (long)(_Var13._M_head_impl)->params->number_of_exact_path_graphs;
            uVar18 = uVar18 + 1) {
          uVar6 = this->pattern_size;
          for (uVar7 = 0; uVar7 < uVar6; uVar7 = uVar7 + 1) {
            local_490 = (long *)CONCAT44(local_490._4_4_,uVar7);
            for (uVar15 = 0; uVar15 < uVar6; uVar15 = uVar15 + 1) {
              if (uVar7 != uVar15) {
                local_4b0 = (int)uVar18;
                bVar5 = SVOBitset::test((SVOBitset *)
                                        ((ulong)(this->max_graphs * uVar7 + local_4b0) * 0x88 +
                                        *(long *)&(((this->_imp)._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->pattern_graph_rows).
                                                  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                        ),uVar15);
                uVar6 = (uint)local_490;
                uVar7 = (uint)local_490;
                if (bVar5) {
                  pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&t_gds,this,(uint)local_490);
                  pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&n_p,this,uVar15);
                  SVOBitset::SVOBitset
                            (&np,(SVOBitset *)
                                 ((ulong)(this->max_graphs * uVar6) * 0x88 +
                                 *(long *)&(((this->_imp)._M_t.
                                             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                             .
                                             super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                            ._M_head_impl)->pattern_graph_rows).
                                           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                 ));
                  SVOBitset::operator&=
                            (&np,(SVOBitset *)
                                 ((ulong)(this->max_graphs * uVar15) * 0x88 +
                                 *(long *)&(((this->_imp)._M_t.
                                             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                             .
                                             super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                            ._M_head_impl)->pattern_graph_rows).
                                           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                 ));
                  between_p_and_q.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  between_p_and_q.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  between_p_and_q.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  do {
                    uVar6 = SVOBitset::find_first(&np);
                    if (uVar6 == 0xffffffff) break;
                    SVOBitset::reset(&np,uVar6);
                    pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&patterns,this,uVar6);
                    std::
                    vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                    ::emplace_back<std::pair<int,std::__cxx11::string>>
                              ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                *)&between_p_and_q,(NamedVertex *)&patterns);
                    std::__cxx11::string::~string
                              ((string *)
                               &patterns.
                                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
                  } while ((ulong)(((long)between_p_and_q.
                                          super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)between_p_and_q.
                                         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0x28) < uVar18
                          );
                  uVar6 = 0;
                  while (uVar6 < this->target_size) {
                    target_vertex_for_proof_abi_cxx11_((NamedVertex *)&n_t,this,uVar6);
                    named_n_t.
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    named_d_n_t.
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    named_two_away_from_t.
                    super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_4a0 = (Proof *)CONCAT44(local_4a0._4_4_,uVar6);
                    named_n_t.
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    named_n_t.
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    named_d_n_t.
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    named_d_n_t.
                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    named_two_away_from_t.
                    super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    named_two_away_from_t.
                    super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    SVOBitset::SVOBitset
                              ((SVOBitset *)&patterns,
                               (SVOBitset *)
                               ((ulong)(this->max_graphs * uVar6) * 0x88 +
                               *(long *)&(((this->_imp)._M_t.
                                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           .
                                           super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                          ._M_head_impl)->target_graph_rows).
                                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                               ));
                    while (uVar6 = SVOBitset::find_first((SVOBitset *)&patterns),
                          uVar6 != 0xffffffff) {
                      SVOBitset::reset((SVOBitset *)&patterns,uVar6);
                      target_vertex_for_proof_abi_cxx11_((NamedVertex *)&targets,this,uVar6);
                      std::
                      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      ::emplace_back<std::pair<int,std::__cxx11::string>>
                                ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                  *)&named_n_t,(NamedVertex *)&targets);
                      std::__cxx11::string::~string
                                ((string *)
                                 &targets.
                                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
                    }
                    SVOBitset::SVOBitset
                              ((SVOBitset *)&targets,
                               (SVOBitset *)
                               ((ulong)(this->max_graphs * (int)local_4a0 + local_4b0) * 0x88 +
                               *(long *)&(((this->_imp)._M_t.
                                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           .
                                           super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                          ._M_head_impl)->target_graph_rows).
                                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                               ));
                    while( true ) {
                      uVar6 = SVOBitset::find_first((SVOBitset *)&targets);
                      if (uVar6 == 0xffffffff) break;
                      SVOBitset::reset((SVOBitset *)&targets,uVar6);
                      target_vertex_for_proof_abi_cxx11_((NamedVertex *)&n2_t,this,uVar6);
                      std::
                      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      ::emplace_back<std::pair<int,std::__cxx11::string>>
                                ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                  *)&named_d_n_t,
                                 (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&n2_t);
                      std::__cxx11::string::~string((string *)((long)&n2_t._data + 8));
                    }
                    SVOBitset::SVOBitset
                              (&n2_t,(SVOBitset *)
                                     ((ulong)(this->max_graphs * (int)local_4a0 + 1) * 0x88 +
                                     *(long *)&(((this->_imp)._M_t.
                                                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                 .
                                                 super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                ._M_head_impl)->target_graph_rows).
                                               super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                     ));
                    while( true ) {
                      uVar6 = SVOBitset::find_first(&n2_t);
                      if (uVar6 == 0xffffffff) break;
                      SVOBitset::reset(&n2_t,uVar6);
                      SVOBitset::SVOBitset
                                ((SVOBitset *)&p_gds,
                                 (SVOBitset *)
                                 ((ulong)(this->max_graphs * uVar6) * 0x88 +
                                 *(long *)&(((this->_imp)._M_t.
                                             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                             .
                                             super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                            ._M_head_impl)->target_graph_rows).
                                           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                 ));
                      SVOBitset::operator&=
                                ((SVOBitset *)&p_gds,
                                 (SVOBitset *)
                                 ((ulong)(this->max_graphs * (int)local_4a0) * 0x88 +
                                 *(long *)&(((this->_imp)._M_t.
                                             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                             .
                                             super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                            ._M_head_impl)->target_graph_rows).
                                           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                 ));
                      named_n_t_w.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      named_n_t_w.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      named_n_t_w.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      while (uVar7 = SVOBitset::find_first((SVOBitset *)&p_gds), uVar7 != 0xffffffff
                            ) {
                        SVOBitset::reset((SVOBitset *)&p_gds,uVar7);
                        target_vertex_for_proof_abi_cxx11_(&named_p_1,this,uVar7);
                        std::
                        vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                        ::emplace_back<std::pair<int,std::__cxx11::string>>
                                  ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                    *)&named_n_t_w,&named_p_1);
                        std::__cxx11::string::~string((string *)&named_p_1.second);
                      }
                      target_vertex_for_proof_abi_cxx11_(&named_p_1,this,uVar6);
                      std::
                      vector<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>>>
                      ::
                      emplace_back<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>&>
                                ((vector<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>>>
                                  *)&named_two_away_from_t,&named_p_1,&named_n_t_w);
                      std::__cxx11::string::~string((string *)&named_p_1.second);
                      std::
                      vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~vector(&named_n_t_w);
                      SVOBitset::~SVOBitset((SVOBitset *)&p_gds);
                    }
                    Proof::create_exact_path_graphs
                              ((((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 .
                                 super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                ._M_head_impl)->proof).
                               super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,local_4b0,(NamedVertex *)&t_gds,(NamedVertex *)&n_p,
                               &between_p_and_q,(NamedVertex *)&n_t,&named_n_t,
                               &named_two_away_from_t,&named_d_n_t);
                    SVOBitset::~SVOBitset(&n2_t);
                    SVOBitset::~SVOBitset((SVOBitset *)&targets);
                    SVOBitset::~SVOBitset((SVOBitset *)&patterns);
                    std::
                    vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    ::~vector(&named_two_away_from_t);
                    std::
                    vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::~vector(&named_d_n_t);
                    std::
                    vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::~vector(&named_n_t);
                    std::__cxx11::string::~string
                              ((string *)
                               &n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish);
                    uVar6 = (int)local_4a0 + 1;
                  }
                  std::
                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector(&between_p_and_q);
                  SVOBitset::~SVOBitset(&np);
                  std::__cxx11::string::~string
                            ((string *)
                             &n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish);
                  std::__cxx11::string::~string
                            ((string *)
                             &t_gds.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
                  uVar7 = (uint)local_490;
                }
              }
              uVar6 = this->pattern_size;
            }
          }
          _Var13._M_head_impl =
               (this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        }
      }
    }
    bVar5 = supports_distance2_graphs((_Var13._M_head_impl)->params);
    if (bVar5) {
      _Var13._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      _build_exact_path_graphs
                (this,&(_Var13._M_head_impl)->pattern_graph_rows,this->pattern_size,
                 &next_pattern_supplemental,1,(_Var13._M_head_impl)->directed,true,true);
      _Var13._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      _build_exact_path_graphs
                (this,&(_Var13._M_head_impl)->target_graph_rows,this->target_size,
                 &next_target_supplemental,1,(_Var13._M_head_impl)->directed,true,false);
    }
    bVar5 = supports_distance3_graphs
                      (((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                       _M_head_impl)->params);
    _Var13._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    if (bVar5) {
      _build_distance3_graphs
                (this,&(_Var13._M_head_impl)->pattern_graph_rows,this->pattern_size,
                 &next_pattern_supplemental,true);
      _build_distance3_graphs
                (this,&((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                       _M_head_impl)->target_graph_rows,this->target_size,&next_target_supplemental,
                 false);
      _Var13._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      if (((_Var13._M_head_impl)->proof).
          super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        uVar6 = this->pattern_size;
        uVar7 = 0;
        while (uVar7 < uVar6) {
          local_484 = uVar7;
          for (uVar15 = 0; uVar7 = local_484, uVar15 < uVar6; uVar15 = uVar15 + 1) {
            pattern_vertex_for_proof_abi_cxx11_(&named_p_1,this,local_484);
            pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&between_p_and_q,this,uVar15);
            if (uVar7 != uVar15) {
              local_490 = (long *)(ulong)next_pattern_supplemental;
              bVar5 = SVOBitset::test((SVOBitset *)
                                      ((ulong)((next_pattern_supplemental - 1) +
                                              this->max_graphs * uVar7) * 0x88 +
                                      *(long *)&(((this->_imp)._M_t.
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                 ._M_head_impl)->pattern_graph_rows).
                                                super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                      ),uVar15);
              if (bVar5) {
                SVOBitset::SVOBitset
                          (&np,(SVOBitset *)
                               ((ulong)(this->max_graphs * local_484) * 0x88 +
                               *(long *)&(((this->_imp)._M_t.
                                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           .
                                           super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                          ._M_head_impl)->pattern_graph_rows).
                                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                               ));
                bVar5 = SVOBitset::test(&np,uVar15);
                local_480 = (long *)CONCAT71(local_480._1_7_,bVar5);
                if (!bVar5) {
                  SVOBitset::SVOBitset
                            ((SVOBitset *)&patterns,
                             (SVOBitset *)
                             ((ulong)(this->max_graphs * uVar15) * 0x88 +
                             *(long *)&(((this->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                         .
                                         super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                        ._M_head_impl)->pattern_graph_rows).
                                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                             ));
                  SVOBitset::SVOBitset((SVOBitset *)&targets,&np);
                  SVOBitset::operator&=((SVOBitset *)&targets,(SVOBitset *)&patterns);
                  SVOBitset::reset((SVOBitset *)&targets,local_484);
                  SVOBitset::reset((SVOBitset *)&targets,uVar15);
                  bVar5 = SVOBitset::any((SVOBitset *)&targets);
                  if (bVar5) {
                    uVar6 = SVOBitset::find_first((SVOBitset *)&targets);
                    pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&n2_t,this,uVar6);
                    std::optional<std::pair<int,std::__cxx11::string>>::operator=
                              ((optional<std::pair<int,std::__cxx11::string>> *)&p_gds,
                               (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&n2_t);
                    std::__cxx11::string::~string((string *)((long)&n2_t._data + 8));
                  }
                  else {
                    SVOBitset::reset(&np,local_484);
                    SVOBitset::reset(&np,uVar15);
                    while (uVar6 = SVOBitset::find_first(&np), uVar6 != 0xffffffff) {
                      SVOBitset::reset(&np,uVar6);
                      SVOBitset::SVOBitset
                                (&n2_t,(SVOBitset *)
                                       ((ulong)(this->max_graphs * uVar6) * 0x88 +
                                       *(long *)&(((this->_imp)._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->pattern_graph_rows).
                                                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                       ));
                      SVOBitset::reset(&n2_t,uVar6);
                      SVOBitset::reset(&n2_t,local_484);
                      SVOBitset::reset(&n2_t,uVar15);
                      while (uVar7 = SVOBitset::find_first(&n2_t), uVar7 != 0xffffffff) {
                        SVOBitset::reset(&n2_t,uVar7);
                        local_4a0 = (Proof *)CONCAT44(local_4a0._4_4_,uVar7);
                        bVar5 = SVOBitset::test((SVOBitset *)
                                                ((ulong)(this->max_graphs * uVar7) * 0x88 +
                                                *(long *)&(((this->_imp)._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->pattern_graph_rows).
                                                  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                                ),uVar15);
                        if (bVar5) {
                          pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&n_p,this,uVar6);
                          std::optional<std::pair<int,std::__cxx11::string>>::operator=
                                    ((optional<std::pair<int,std::__cxx11::string>> *)&p_gds,
                                     (NamedVertex *)&n_p);
                          std::__cxx11::string::~string
                                    ((string *)
                                     &n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish);
                          pattern_vertex_for_proof_abi_cxx11_
                                    ((NamedVertex *)&n_p,this,(int)local_4a0);
                          std::optional<std::pair<int,std::__cxx11::string>>::operator=
                                    ((optional<std::pair<int,std::__cxx11::string>> *)&t_gds,
                                     (NamedVertex *)&n_p);
                          std::__cxx11::string::~string
                                    ((string *)
                                     &n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish);
                        }
                      }
                      SVOBitset::~SVOBitset(&n2_t);
                    }
                  }
                  this_00 = (ProofError *)__cxa_allocate_exception(0x28);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&n_t,"Oops, there\'s a bug: missing path from ",
                                 &named_p_1.second);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&n_p,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&n_t," to ");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&n2_t,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&n_p,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&between_p_and_q.
                                     super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
                  ProofError::ProofError(this_00,(string *)&n2_t);
                  __cxa_throw(this_00,&ProofError::typeinfo,ProofError::~ProofError);
                }
                local_490 = (long *)(ulong)((int)local_490 - 1);
                uVar6 = 0;
                while (uVar6 < this->target_size) {
                  target_vertex_for_proof_abi_cxx11_((NamedVertex *)&named_n_t,this,uVar6);
                  n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish = (pointer)((ulong)n_p.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_finish &
                                       0xffffffff00000000);
                  n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage = (pointer)0x0;
                  n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish = (pointer)((ulong)n_t.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_finish &
                                       0xffffffff00000000);
                  n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage = (pointer)0x0;
                  named_two_away_from_t.
                  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  named_n_t_w.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  d3_from_t.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  named_two_away_from_t.
                  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  named_two_away_from_t.
                  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  named_n_t_w.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  named_n_t_w.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  d3_from_t.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  d3_from_t.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  SVOBitset::SVOBitset
                            ((SVOBitset *)&patterns,
                             (SVOBitset *)
                             ((ulong)(this->max_graphs * uVar6) * 0x88 +
                             *(long *)&(((this->_imp)._M_t.
                                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                         .
                                         super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                        ._M_head_impl)->target_graph_rows).
                                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                             ));
                  local_4a0 = (Proof *)CONCAT44(local_4a0._4_4_,uVar6);
                  SVOBitset::set((SVOBitset *)&patterns,uVar6);
                  while( true ) {
                    uVar6 = SVOBitset::find_first((SVOBitset *)&patterns);
                    if (uVar6 == 0xffffffff) break;
                    SVOBitset::reset((SVOBitset *)&patterns,uVar6);
                    target_vertex_for_proof_abi_cxx11_((NamedVertex *)&targets,this,uVar6);
                    std::
                    vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                    ::emplace_back<std::pair<int,std::__cxx11::string>>
                              ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                *)&named_two_away_from_t,
                               (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&targets);
                    std::__cxx11::string::~string
                              ((string *)
                               &targets.
                                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
                    SVOBitset::SVOBitset
                              ((SVOBitset *)&targets,
                               (SVOBitset *)
                               ((ulong)(this->max_graphs * uVar6) * 0x88 +
                               *(long *)&(((this->_imp)._M_t.
                                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           .
                                           super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                          ._M_head_impl)->target_graph_rows).
                                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                               ));
                    SVOBitset::set((SVOBitset *)&targets,uVar6);
                    while( true ) {
                      uVar6 = SVOBitset::find_first((SVOBitset *)&targets);
                      if (uVar6 == 0xffffffff) break;
                      SVOBitset::reset((SVOBitset *)&targets,uVar6);
                      target_vertex_for_proof_abi_cxx11_((NamedVertex *)&n2_t,this,uVar6);
                      std::
                      _Rb_tree<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::_Identity<std::pair<int,std::__cxx11::string>>,std::less<std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      ::_M_insert_unique<std::pair<int,std::__cxx11::string>>
                                ((_Rb_tree<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::_Identity<std::pair<int,std::__cxx11::string>>,std::less<std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                  *)&n_p,(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&n2_t);
                      std::__cxx11::string::~string((string *)((long)&n2_t._data + 8));
                      SVOBitset::SVOBitset
                                (&n2_t,(SVOBitset *)
                                       ((ulong)(this->max_graphs * uVar6) * 0x88 +
                                       *(long *)&(((this->_imp)._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->target_graph_rows).
                                                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                       ));
                      SVOBitset::set(&n2_t,uVar6);
                      while (uVar6 = SVOBitset::find_first(&n2_t), uVar6 != 0xffffffff) {
                        SVOBitset::reset(&n2_t,uVar6);
                        target_vertex_for_proof_abi_cxx11_((NamedVertex *)&named_d_n_t,this,uVar6);
                        std::
                        _Rb_tree<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::_Identity<std::pair<int,std::__cxx11::string>>,std::less<std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<int,std::__cxx11::string>>>
                        ::_M_insert_unique<std::pair<int,std::__cxx11::string>>
                                  ((_Rb_tree<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,std::_Identity<std::pair<int,std::__cxx11::string>>,std::less<std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<int,std::__cxx11::string>>>
                                    *)&n_t,(NamedVertex *)&named_d_n_t);
                        std::__cxx11::string::~string
                                  ((string *)
                                   &named_d_n_t.
                                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
                      }
                      SVOBitset::~SVOBitset(&n2_t);
                    }
                    SVOBitset::~SVOBitset((SVOBitset *)&targets);
                  }
                  std::
                  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                  ::_M_assign_aux<std::_Rb_tree_const_iterator<std::pair<int,std::__cxx11::string>>>
                            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                              *)&named_n_t_w,
                             &n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish,
                             &n_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish);
                  std::
                  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                  ::_M_assign_aux<std::_Rb_tree_const_iterator<std::pair<int,std::__cxx11::string>>>
                            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                              *)&d3_from_t,
                             &n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish,
                             &n_t.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish);
                  if ((char)local_480 == '\0') {
                    Proof::create_distance3_graphs_but_actually_distance_2
                              ((((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 .
                                 super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                ._M_head_impl)->proof).
                               super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,(int)local_490,&named_p_1,(NamedVertex *)&between_p_and_q,
                               (NamedVertex *)&p_gds,(NamedVertex *)&named_n_t,
                               (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&named_two_away_from_t,&named_n_t_w,&d3_from_t);
                  }
                  else {
                    Proof::create_distance3_graphs_but_actually_distance_1
                              ((((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 .
                                 super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                ._M_head_impl)->proof).
                               super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,(int)local_490,&named_p_1,(NamedVertex *)&between_p_and_q,
                               (NamedVertex *)&named_n_t,&d3_from_t);
                  }
                  SVOBitset::~SVOBitset((SVOBitset *)&patterns);
                  std::
                  _Rb_tree<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~_Rb_tree((_Rb_tree<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&n_t);
                  std::
                  _Rb_tree<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~_Rb_tree((_Rb_tree<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&n_p);
                  std::
                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector(&d3_from_t);
                  std::
                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector(&named_n_t_w);
                  std::
                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&named_two_away_from_t);
                  std::__cxx11::string::~string
                            ((string *)
                             &named_n_t.
                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
                  uVar6 = (int)local_4a0 + 1;
                }
                SVOBitset::~SVOBitset(&np);
                std::
                _Optional_payload_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_reset((_Optional_payload_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&t_gds);
                std::
                _Optional_payload_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_reset((_Optional_payload_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&p_gds);
              }
            }
            std::__cxx11::string::~string
                      ((string *)
                       &between_p_and_q.
                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
            std::__cxx11::string::~string((string *)&named_p_1.second);
            uVar6 = this->pattern_size;
          }
          uVar7 = local_484 + 1;
        }
        _Var13._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      }
    }
    bVar5 = supports_k4_graphs((_Var13._M_head_impl)->params);
    if (bVar5) {
      _build_k4_graphs(this,&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                             _M_head_impl)->pattern_graph_rows,this->pattern_size,
                       &next_pattern_supplemental,true);
      _build_k4_graphs(this,&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                             _M_head_impl)->target_graph_rows,this->target_size,
                       &next_target_supplemental,false);
    }
    local_490 = (long *)((long)((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                .
                                super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                               ._M_head_impl)->params + 0x70);
    plVar19 = local_490;
    while (uVar7 = next_target_supplemental, uVar6 = next_pattern_supplemental,
          plVar19 = (long *)*plVar19, plVar19 != local_490) {
      _build_extra_shape(this,&((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                .
                                super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                               ._M_head_impl)->pattern_graph_rows,this->pattern_size,
                         &next_pattern_supplemental,(InputGraph *)plVar19[3],
                         *(bool *)((long)plVar19 + 0x14),*(int *)(plVar19 + 2),true);
      _build_extra_shape(this,&((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                .
                                super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                               ._M_head_impl)->target_graph_rows,this->target_size,
                         &next_target_supplemental,(InputGraph *)plVar19[3],
                         *(bool *)((long)plVar19 + 0x14),*(int *)(plVar19 + 2),false);
      if (*(long *)&(((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                     _M_head_impl)->proof).
                    super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0) {
        local_4a0 = (Proof *)CONCAT44(local_4a0._4_4_,next_pattern_supplemental - 1);
        uVar6 = this->pattern_size;
        local_480 = plVar19;
        for (uVar7 = 0; plVar19 = local_480, uVar7 < uVar6; uVar7 = uVar7 + 1) {
          for (uVar15 = 0; uVar15 < uVar6; uVar15 = uVar15 + 1) {
            pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&patterns,this,uVar7);
            pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)&targets,this,uVar15);
            bVar5 = SVOBitset::test((SVOBitset *)
                                    ((ulong)(this->max_graphs * uVar7 + (int)local_4a0) * 0x88 +
                                    *(long *)&(((this->_imp)._M_t.
                                                super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                .
                                                super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                               ._M_head_impl)->pattern_graph_rows).
                                              super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                    ),uVar15);
            if (bVar5) {
              for (uVar6 = 0; uVar6 < this->target_size; uVar6 = uVar6 + 1) {
                target_vertex_for_proof_abi_cxx11_((NamedVertex *)&n2_t,this,uVar6);
                t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                t_gds.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                SVOBitset::SVOBitset
                          (&np,(SVOBitset *)
                               ((ulong)(this->max_graphs * uVar6 + (int)local_4a0) * 0x88 +
                               *(long *)&(((this->_imp)._M_t.
                                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                           .
                                           super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                          ._M_head_impl)->target_graph_rows).
                                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                               ));
                while (uVar8 = SVOBitset::find_first(&np), uVar8 != 0xffffffff) {
                  SVOBitset::reset(&np,uVar8);
                  target_vertex_for_proof_abi_cxx11_((NamedVertex *)&p_gds,this,uVar8);
                  std::
                  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                  ::emplace_back<std::pair<int,std::__cxx11::string>>
                            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                              *)&t_gds,(NamedVertex *)&p_gds);
                  std::__cxx11::string::~string
                            ((string *)
                             &p_gds.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
                }
                Proof::hack_in_shape_graph
                          ((((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                            _M_head_impl)->proof).
                           super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,(int)local_4a0,(NamedVertex *)&patterns,(NamedVertex *)&targets,
                           (NamedVertex *)&n2_t,
                           (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&t_gds);
                SVOBitset::~SVOBitset(&np);
                std::
                vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&t_gds);
                std::__cxx11::string::~string((string *)((long)&n2_t._data + 8));
              }
            }
            std::__cxx11::string::~string
                      ((string *)
                       &targets.
                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
            std::__cxx11::string::~string
                      ((string *)
                       &patterns.
                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
            uVar6 = this->pattern_size;
          }
        }
      }
    }
    uVar18 = (ulong)next_pattern_supplemental;
    if (((next_pattern_supplemental != this->max_graphs) ||
        (next_target_supplemental != this->max_graphs)) ||
       (*(size_t *)
         ((long)&((this->_imp)._M_t.
                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl
                 )->supplemental_graph_names + 0x10) != uVar18)) {
      this_01 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string((string *)&n_t,uVar6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n_p,
                     "something has gone wrong with supplemental graph indexing: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n_t);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t_gds,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n_p," ");
      std::__cxx11::to_string((string *)&named_p_1,uVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_gds,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t_gds,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&named_p_1
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n2_t,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_gds," "
                    );
      std::__cxx11::to_string((string *)&between_p_and_q,this->max_graphs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n2_t,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &between_p_and_q);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&patterns,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                     " ");
      std::__cxx11::to_string
                ((string *)&named_n_t,
                 *(size_t *)
                  ((long)&((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                          _M_head_impl)->supplemental_graph_names + 0x10));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&np,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&patterns,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&named_n_t
                    );
      UnsupportedConfiguration::UnsupportedConfiguration(this_01,(string *)&np);
      __cxa_throw(this_01,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    for (uVar17 = 1; uVar17 < uVar18; uVar17 = uVar17 + 1) {
      pvVar9 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at(&((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                     _M_head_impl)->patterns_degrees,uVar17);
      std::vector<int,_std::allocator<int>_>::resize(pvVar9,(ulong)this->pattern_size);
      pvVar9 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at(&((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                     _M_head_impl)->targets_degrees,uVar17);
      std::vector<int,_std::allocator<int>_>::resize(pvVar9,(ulong)this->target_size);
      uVar18 = (ulong)this->max_graphs;
    }
    for (uVar17 = 1; uVar17 < uVar18; uVar17 = uVar17 + 1) {
      for (uVar18 = 0; uVar18 < this->pattern_size; uVar18 = uVar18 + 1) {
        uVar6 = SVOBitset::count((SVOBitset *)
                                 ((ulong)(this->max_graphs * (int)uVar18 + (int)uVar17) * 0x88 +
                                 *(long *)&(((this->_imp)._M_t.
                                             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                             .
                                             super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                            ._M_head_impl)->pattern_graph_rows).
                                           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                 ));
        pvVar9 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::at(&((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                       _M_head_impl)->patterns_degrees,uVar17);
        puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::at(pvVar9,uVar18);
        *puVar10 = uVar6;
      }
      for (uVar18 = 0; uVar18 < this->target_size; uVar18 = uVar18 + 1) {
        uVar6 = SVOBitset::count((SVOBitset *)
                                 ((ulong)(this->max_graphs * (int)uVar18 + (int)uVar17) * 0x88 +
                                 *(long *)&(((this->_imp)._M_t.
                                             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                             .
                                             super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                            ._M_head_impl)->target_graph_rows).
                                           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                 ));
        pvVar9 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::at(&((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                       _M_head_impl)->targets_degrees,uVar17);
        puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::at(pvVar9,uVar18);
        *puVar10 = uVar6;
      }
      uVar18 = (ulong)this->max_graphs;
    }
    uVar6 = this->target_size;
    _Var13._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    for (uVar18 = 0; uVar6 != uVar18; uVar18 = uVar18 + 1) {
      iVar2 = *(int *)(**(long **)&((_Var13._M_head_impl)->targets_degrees).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      + uVar18 * 4);
      if (iVar2 < (_Var13._M_head_impl)->largest_target_degree) {
        iVar2 = (_Var13._M_head_impl)->largest_target_degree;
      }
      (_Var13._M_head_impl)->largest_target_degree = iVar2;
    }
    for (uVar18 = 0; uVar18 < this->pattern_size; uVar18 = uVar18 + 1) {
      _Var13._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      if (*(int *)(*(long *)&((_Var13._M_head_impl)->pattern_loops).
                             super__Vector_base<int,_std::allocator<int>_> + uVar18 * 4) != 0) {
        SVOBitset::set((SVOBitset *)
                       ((ulong)(this->max_graphs * (int)uVar18) * 0x88 +
                       *(long *)&((_Var13._M_head_impl)->pattern_graph_rows).
                                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       ),(int)uVar18);
      }
    }
    for (uVar18 = 0;
        _Var13._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl,
        uVar18 < this->target_size; uVar18 = uVar18 + 1) {
      if (*(int *)(*(long *)&((_Var13._M_head_impl)->target_loops).
                             super__Vector_base<int,_std::allocator<int>_> + uVar18 * 4) != 0) {
        SVOBitset::set((SVOBitset *)
                       ((ulong)(this->max_graphs * (int)uVar18) * 0x88 +
                       *(long *)&((_Var13._M_head_impl)->target_graph_rows).
                                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       ),(int)uVar18);
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&(_Var13._M_head_impl)->pattern_adjacencies_bits,
               (ulong)(this->pattern_size * this->pattern_size));
    for (uVar6 = 0; uVar6 < this->max_graphs; uVar6 = uVar6 + 1) {
      uVar7 = this->pattern_size;
      for (uVar15 = 0; uVar15 < uVar7; uVar15 = uVar15 + 1) {
        for (uVar8 = 0; uVar8 < uVar7; uVar8 = uVar8 + 1) {
          bVar5 = SVOBitset::test((SVOBitset *)
                                  ((ulong)(this->max_graphs * uVar15 + uVar6) * 0x88 +
                                  *(long *)&(((this->_imp)._M_t.
                                              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                              .
                                              super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                             ._M_head_impl)->pattern_graph_rows).
                                            super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                  ),uVar8);
          if (bVar5) {
            pbVar1 = (byte *)(*(long *)&(((this->_imp)._M_t.
                                          super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                          .
                                          super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                         ._M_head_impl)->pattern_adjacencies_bits).
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             + (ulong)(this->pattern_size * uVar15 + uVar8));
            *pbVar1 = *pbVar1 | (byte)(1 << (uVar6 & 0x1f));
          }
          uVar7 = this->pattern_size;
        }
      }
    }
    bVar5 = true;
  }
  return bVar5;
code_r0x00122689:
  uVar6 = uVar6 + 1;
  goto LAB_0012264b;
}

Assistant:

auto HomomorphismModel::prepare() -> bool
{
    if (is_nonshrinking(_imp->params) && (pattern_size > target_size))
        return false;

    _imp->supplemental_graph_names.push_back("original");

    // pattern and target degrees, for the main graph
    _imp->patterns_degrees.at(0).resize(pattern_size);
    _imp->targets_degrees.at(0).resize(target_size);

    for (unsigned i = 0; i < pattern_size; ++i)
        _imp->patterns_degrees.at(0).at(i) = _imp->pattern_graph_rows[i * max_graphs + 0].count();

    for (unsigned i = 0; i < target_size; ++i)
        _imp->targets_degrees.at(0).at(i) = _imp->target_graph_rows[i * max_graphs + 0].count();

    if (global_degree_is_preserved(_imp->params)) {
        vector<pair<int, int>> p_gds, t_gds;
        for (unsigned i = 0; i < pattern_size; ++i)
            p_gds.emplace_back(i, _imp->patterns_degrees.at(0).at(i));
        for (unsigned i = 0; i < target_size; ++i)
            t_gds.emplace_back(i, _imp->targets_degrees.at(0).at(i));

        sort(p_gds.begin(), p_gds.end(), [](const pair<int, int> & a, const pair<int, int> & b) { return a.second > b.second; });
        sort(t_gds.begin(), t_gds.end(), [](const pair<int, int> & a, const pair<int, int> & b) { return a.second > b.second; });

        for (unsigned i = 0; i < p_gds.size(); ++i)
            if (p_gds.at(i).second > t_gds.at(i).second) {
                if (_imp->proof) {
                    for (unsigned p = 0; p <= i; ++p) {
                        vector<int> n_p;
                        auto np = _imp->pattern_graph_rows[p_gds.at(p).first * max_graphs + 0];
                        for (unsigned j = 0; j < pattern_size; ++j)
                            if (np.test(j))
                                n_p.push_back(j);

                        for (unsigned t = i; t < t_gds.size(); ++t) {
                            vector<int> n_t;
                            auto nt = _imp->target_graph_rows[t_gds.at(t).first * max_graphs + 0];
                            for (auto j = nt.find_first(); j != decltype(nt)::npos; j = nt.find_first()) {
                                nt.reset(j);
                                n_t.push_back(j);
                            }

                            _imp->proof->incompatible_by_degrees(0,
                                pattern_vertex_for_proof(p_gds.at(p).first), n_p,
                                target_vertex_for_proof(t_gds.at(t).first), n_t);
                        }
                    }

                    vector<NamedVertex> patterns, targets;
                    for (unsigned p = 0; p <= i; ++p)
                        patterns.push_back(pattern_vertex_for_proof(p_gds.at(p).first));
                    for (unsigned t = 0; t < i; ++t)
                        targets.push_back(target_vertex_for_proof(t_gds.at(t).first));

                    _imp->proof->emit_hall_set_or_violator(patterns, targets);
                }
                return false;
            }
    }

    unsigned next_pattern_supplemental = 1, next_target_supplemental = 1;
    // build exact path graphs
    if (supports_exact_path_graphs(_imp->params)) {
        _build_exact_path_graphs(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, _imp->params.number_of_exact_path_graphs, _imp->directed, false, true);
        _build_exact_path_graphs(_imp->target_graph_rows, target_size, next_target_supplemental, _imp->params.number_of_exact_path_graphs, _imp->directed, false, false);

        if (_imp->proof) {
            for (int g = 1; g <= _imp->params.number_of_exact_path_graphs; ++g) {
                for (unsigned p = 0; p < pattern_size; ++p) {
                    for (unsigned q = 0; q < pattern_size; ++q) {
                        if (p == q || ! _imp->pattern_graph_rows[p * max_graphs + g].test(q))
                            continue;

                        auto named_p = pattern_vertex_for_proof(p);
                        auto named_q = pattern_vertex_for_proof(q);

                        auto n_p_q = _imp->pattern_graph_rows[p * max_graphs + 0];
                        n_p_q &= _imp->pattern_graph_rows[q * max_graphs + 0];
                        vector<NamedVertex> between_p_and_q;
                        for (auto v = n_p_q.find_first(); v != decltype(n_p_q)::npos; v = n_p_q.find_first()) {
                            n_p_q.reset(v);
                            between_p_and_q.push_back(pattern_vertex_for_proof(v));
                            if (between_p_and_q.size() >= unsigned(g))
                                break;
                        }

                        for (unsigned t = 0; t < target_size; ++t) {
                            auto named_t = target_vertex_for_proof(t);

                            vector<NamedVertex> named_n_t, named_d_n_t;
                            vector<pair<NamedVertex, vector<NamedVertex>>> named_two_away_from_t;
                            auto n_t = _imp->target_graph_rows[t * max_graphs + 0];
                            for (auto w = n_t.find_first(); w != decltype(n_t)::npos; w = n_t.find_first()) {
                                n_t.reset(w);
                                named_n_t.push_back(target_vertex_for_proof(w));
                            }

                            auto nd_t = _imp->target_graph_rows[t * max_graphs + g];
                            for (auto w = nd_t.find_first(); w != decltype(nd_t)::npos; w = nd_t.find_first()) {
                                nd_t.reset(w);
                                named_d_n_t.push_back(target_vertex_for_proof(w));
                            }

                            auto n2_t = _imp->target_graph_rows[t * max_graphs + 1];
                            for (auto w = n2_t.find_first(); w != decltype(n2_t)::npos; w = n2_t.find_first()) {
                                n2_t.reset(w);
                                auto n_t_w = _imp->target_graph_rows[w * max_graphs + 0];
                                n_t_w &= _imp->target_graph_rows[t * max_graphs + 0];
                                vector<NamedVertex> named_n_t_w;
                                for (auto x = n_t_w.find_first(); x != decltype(n_t_w)::npos; x = n_t_w.find_first()) {
                                    n_t_w.reset(x);
                                    named_n_t_w.push_back(target_vertex_for_proof(x));
                                }
                                named_two_away_from_t.emplace_back(target_vertex_for_proof(w), named_n_t_w);
                            }

                            _imp->proof->create_exact_path_graphs(g, named_p, named_q, between_p_and_q,
                                named_t, named_n_t, named_two_away_from_t, named_d_n_t);
                        }
                    }
                }
            }
        }
    }

    if (supports_distance2_graphs(_imp->params)) {
        _build_exact_path_graphs(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, 1, _imp->directed, true, true);
        _build_exact_path_graphs(_imp->target_graph_rows, target_size, next_target_supplemental, 1, _imp->directed, true, false);
    }

    if (supports_distance3_graphs(_imp->params)) {
        _build_distance3_graphs(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, true);
        _build_distance3_graphs(_imp->target_graph_rows, target_size, next_target_supplemental, false);

        if (_imp->proof) {
            for (unsigned p = 0; p < pattern_size; ++p) {
                for (unsigned q = 0; q < pattern_size; ++q) {
                    auto named_p = pattern_vertex_for_proof(p);
                    auto named_q = pattern_vertex_for_proof(q);

                    // only do this if they're actually adjacent
                    if (p == q || ! _imp->pattern_graph_rows[p * max_graphs + next_pattern_supplemental - 1].test(q))
                        continue;

                    bool actually_adjacent = false;
                    optional<NamedVertex> path_from_p_to_q_1 = nullopt, path_from_p_to_q_2 = nullopt;

                    auto n_p = _imp->pattern_graph_rows[p * max_graphs + 0];

                    // are they actually distance 1 apart?
                    if (n_p.test(q))
                        actually_adjacent = true;
                    else {
                        auto n_q = _imp->pattern_graph_rows[q * max_graphs + 0];

                        auto n_p_q = n_p;
                        n_p_q &= n_q;
                        n_p_q.reset(p);
                        n_p_q.reset(q);

                        if (n_p_q.any()) {
                            // they're actually distance 2 apart
                            path_from_p_to_q_1 = pattern_vertex_for_proof(n_p_q.find_first());
                        }
                        else {
                            // find a path of length 3
                            n_p.reset(p);
                            n_p.reset(q);
                            for (auto v = n_p.find_first(); v != decltype(n_p)::npos && ! path_from_p_to_q_1; v = n_p.find_first()) {
                                n_p.reset(v);
                                auto n_v = _imp->pattern_graph_rows[v * max_graphs + 0];
                                n_v.reset(v);
                                n_v.reset(p);
                                n_v.reset(q);
                                for (auto w = n_v.find_first(); w != decltype(n_v)::npos && ! path_from_p_to_q_1; w = n_v.find_first()) {
                                    n_v.reset(w);
                                    if (_imp->pattern_graph_rows[w * max_graphs + 0].test(q)) {
                                        path_from_p_to_q_1 = pattern_vertex_for_proof(v);
                                        path_from_p_to_q_2 = pattern_vertex_for_proof(w);
                                    }
                                }
                            }
                        }

                        if (! path_from_p_to_q_1)
                            throw ProofError{"Oops, there's a bug: missing path from " + named_p.second + " to " + named_q.second};
                    }

                    for (unsigned t = 0; t < target_size; ++t) {
                        auto named_t = target_vertex_for_proof(t);

                        vector<NamedVertex> d1_from_t, d2_from_t, d3_from_t;
                        set<NamedVertex> d2_from_t_set, d3_from_t_set;
                        auto n_t = _imp->target_graph_rows[t * max_graphs + 0];
                        n_t.set(t);
                        for (auto v = n_t.find_first(); v != decltype(n_t)::npos; v = n_t.find_first()) {
                            n_t.reset(v);
                            d1_from_t.push_back(target_vertex_for_proof(v));
                            auto n_v = _imp->target_graph_rows[v * max_graphs + 0];
                            n_v.set(v);
                            for (auto w = n_v.find_first(); w != decltype(n_v)::npos; w = n_v.find_first()) {
                                n_v.reset(w);
                                d2_from_t_set.insert(target_vertex_for_proof(w));
                                auto n_w = _imp->target_graph_rows[w * max_graphs + 0];
                                n_w.set(w);
                                for (auto x = n_w.find_first(); x != decltype(n_w)::npos; x = n_w.find_first()) {
                                    n_w.reset(x);
                                    d3_from_t_set.insert(target_vertex_for_proof(x));
                                }
                            }
                        }

                        d2_from_t.assign(d2_from_t_set.begin(), d2_from_t_set.end());
                        d3_from_t.assign(d3_from_t_set.begin(), d3_from_t_set.end());

                        if (actually_adjacent)
                            _imp->proof->create_distance3_graphs_but_actually_distance_1(next_pattern_supplemental - 1, named_p, named_q, named_t, d3_from_t);
                        else if (path_from_p_to_q_2)
                            _imp->proof->create_distance3_graphs(next_pattern_supplemental - 1, named_p, named_q, *path_from_p_to_q_1,
                                *path_from_p_to_q_2, named_t, d1_from_t, d2_from_t, d3_from_t);
                        else
                            _imp->proof->create_distance3_graphs_but_actually_distance_2(next_pattern_supplemental - 1, named_p, named_q, *path_from_p_to_q_1,
                                named_t, d1_from_t, d2_from_t, d3_from_t);
                    }
                }
            }
        }
    }

    if (supports_k4_graphs(_imp->params)) {
        _build_k4_graphs(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, true);
        _build_k4_graphs(_imp->target_graph_rows, target_size, next_target_supplemental, false);
    }

    for (auto & [shape, injective, count] : _imp->params.extra_shapes) {
        _build_extra_shape(_imp->pattern_graph_rows, pattern_size, next_pattern_supplemental, *shape, injective, count, true);
        _build_extra_shape(_imp->target_graph_rows, target_size, next_target_supplemental, *shape, injective, count, false);

        if (_imp->proof) {
            for (unsigned p = 0; p < pattern_size; ++p) {
                for (unsigned q = 0; q < pattern_size; ++q) {
                    auto named_p = pattern_vertex_for_proof(p);
                    auto named_q = pattern_vertex_for_proof(q);

                    // only do this if they're actually adjacent
                    if (! _imp->pattern_graph_rows[p * max_graphs + next_pattern_supplemental - 1].test(q))
                        continue;

                    for (unsigned t = 0; t < target_size; ++t) {
                        auto named_t = target_vertex_for_proof(t);
                        vector<NamedVertex> named_n_t;
                        auto n_t = _imp->target_graph_rows[t * max_graphs + next_pattern_supplemental - 1];
                        for (auto v = n_t.find_first(); v != decltype(n_t)::npos; v = n_t.find_first()) {
                            n_t.reset(v);
                            named_n_t.push_back(target_vertex_for_proof(v));
                        }
                        _imp->proof->hack_in_shape_graph(next_pattern_supplemental - 1, named_p, named_q, named_t, named_n_t);
                    }
                }
            }
        }
    }

    if (next_pattern_supplemental != max_graphs || next_target_supplemental != max_graphs ||
            next_pattern_supplemental != _imp->supplemental_graph_names.size())
        throw UnsupportedConfiguration{"something has gone wrong with supplemental graph indexing: " + to_string(next_pattern_supplemental) + " " + to_string(next_target_supplemental) + " " + to_string(max_graphs) + " "
        + to_string(_imp->supplemental_graph_names.size())};

    // pattern and target degrees, for supplemental graphs
    for (unsigned g = 1; g < max_graphs; ++g) {
        _imp->patterns_degrees.at(g).resize(pattern_size);
        _imp->targets_degrees.at(g).resize(target_size);
    }

    for (unsigned g = 1; g < max_graphs; ++g) {
        for (unsigned i = 0; i < pattern_size; ++i)
            _imp->patterns_degrees.at(g).at(i) = _imp->pattern_graph_rows[i * max_graphs + g].count();

        for (unsigned i = 0; i < target_size; ++i)
            _imp->targets_degrees.at(g).at(i) = _imp->target_graph_rows[i * max_graphs + g].count();
    }

    for (unsigned i = 0; i < target_size; ++i)
        _imp->largest_target_degree = max(_imp->largest_target_degree, _imp->targets_degrees[0][i]);

    // re-add loops
    for (unsigned i = 0; i < pattern_size; ++i)
        if (_imp->pattern_loops[i])
            _imp->pattern_graph_rows[i * max_graphs + 0].set(i);

    for (unsigned i = 0; i < target_size; ++i)
        if (_imp->target_loops[i])
            _imp->target_graph_rows[i * max_graphs + 0].set(i);

    // pattern adjacencies, compressed
    _imp->pattern_adjacencies_bits.resize(pattern_size * pattern_size);
    for (unsigned g = 0; g < max_graphs; ++g)
        for (unsigned i = 0; i < pattern_size; ++i)
            for (unsigned j = 0; j < pattern_size; ++j)
                if (_imp->pattern_graph_rows[i * max_graphs + g].test(j))
                    _imp->pattern_adjacencies_bits[i * pattern_size + j] |= (1u << g);

    return true;
}